

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Boolean HTS_pattern_match(char *string,char *pattern)

{
  size_t sVar1;
  char *pcVar2;
  char *in_RSI;
  char *in_RDI;
  size_t pattern_length;
  char buff [1024];
  size_t nquestion;
  size_t nstar;
  size_t max;
  size_t buff_length;
  size_t j;
  size_t i;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  char acStack_44a [1026];
  long local_48;
  long local_40;
  long local_38;
  ulong local_30;
  long local_28;
  ulong local_20;
  char *local_18;
  char *local_10;
  HTS_Boolean local_1;
  
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar1 = strlen(in_RSI);
  for (local_20 = 0; local_20 < sVar1; local_20 = local_20 + 1) {
    in_stack_fffffffffffffbac = (int)local_18[local_20];
    if (in_stack_fffffffffffffbac == 0x2a) {
      local_40 = local_40 + 1;
    }
    else if (in_stack_fffffffffffffbac == 0x3f) {
      local_48 = local_48 + 1;
      local_38 = local_38 + 1;
    }
    else {
      local_38 = local_38 + 1;
    }
  }
  if ((((local_40 == 2) && (local_48 == 0)) && (*local_18 == '*')) &&
     (local_18[local_20 - 1] == '*')) {
    local_30 = local_20 - 2;
    local_28 = 1;
    for (local_20 = 0; local_20 < local_30; local_20 = local_20 + 1) {
      acStack_44a[local_20 + 2] = local_18[local_28];
      local_28 = local_28 + 1;
    }
    acStack_44a[local_30 + 2] = '\0';
    pcVar2 = strstr(local_10,acStack_44a + 2);
    if (pcVar2 == (char *)0x0) {
      local_1 = '\0';
    }
    else {
      local_1 = '\x01';
    }
  }
  else {
    strlen(local_10);
    local_1 = HTS_dp_match((char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                           local_18,(size_t)local_10,0x1995fb);
  }
  return local_1;
}

Assistant:

static HTS_Boolean HTS_pattern_match(const char *string, const char *pattern)
{
   size_t i, j;
   size_t buff_length, max = 0, nstar = 0, nquestion = 0;
   char buff[HTS_MAXBUFLEN];
   size_t pattern_length = strlen(pattern);

   for (i = 0; i < pattern_length; i++) {
      switch (pattern[i]) {
      case '*':
         nstar++;
         break;
      case '?':
         nquestion++;
         max++;
         break;
      default:
         max++;
      }
   }
   if (nstar == 2 && nquestion == 0 && pattern[0] == '*' && pattern[i - 1] == '*') {
      /* only string matching is required */
      buff_length = i - 2;
      for (i = 0, j = 1; i < buff_length; i++, j++)
         buff[i] = pattern[j];
      buff[buff_length] = '\0';
      if (strstr(string, buff) != NULL)
         return TRUE;
      else
         return FALSE;
   } else
      return HTS_dp_match(string, pattern, 0, strlen(string) - max);
}